

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O2

Result __thiscall wabt::ExprVisitor::VisitExprList(ExprVisitor *this,ExprList *exprs)

{
  bool bVar1;
  Result RVar2;
  reference root_expr;
  ExprList *__range1;
  iterator rhs;
  iterator __begin1;
  
  __begin1.node_ = exprs->first_;
  __begin1.list_ = exprs;
  while( true ) {
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = exprs;
    bVar1 = intrusive_list<wabt::Expr>::iterator::operator!=(&__begin1,rhs);
    if (!bVar1) {
      return (Result)Ok;
    }
    root_expr = intrusive_list<wabt::Expr>::iterator::operator*(&__begin1);
    RVar2 = VisitExpr(this,root_expr);
    if (RVar2.enum_ == Error) break;
    intrusive_list<wabt::Expr>::iterator::operator++(&__begin1);
  }
  return (Result)Error;
}

Assistant:

Result ExprVisitor::VisitExprList(ExprList& exprs) {
  for (Expr& expr : exprs)
    CHECK_RESULT(VisitExpr(&expr));
  return Result::Ok;
}